

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int disposition_set_state(DISPOSITION_HANDLE disposition,AMQP_VALUE state_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE state_amqp_value;
  DISPOSITION_INSTANCE *disposition_instance;
  int result;
  AMQP_VALUE state_value_local;
  DISPOSITION_HANDLE disposition_local;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    disposition_instance._4_4_ = 0x22fb;
  }
  else {
    if (state_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(state_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      disposition_instance._4_4_ = 0x230b;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(disposition->composite_value,4,local_30);
      if (iVar1 == 0) {
        disposition_instance._4_4_ = 0;
      }
      else {
        disposition_instance._4_4_ = 0x2311;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return disposition_instance._4_4_;
}

Assistant:

int disposition_set_state(DISPOSITION_HANDLE disposition, AMQP_VALUE state_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        AMQP_VALUE state_amqp_value;
        if (state_value == NULL)
        {
            state_amqp_value = NULL;
        }
        else
        {
            state_amqp_value = amqpvalue_clone(state_value);
        }
        if (state_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(disposition_instance->composite_value, 4, state_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(state_amqp_value);
        }
    }

    return result;
}